

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_urlDecode(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  byte bVar1;
  int iVar2;
  vm_obj_id_t obj;
  size_t sVar3;
  CVmObject *this;
  byte *buf;
  byte *pbVar4;
  long in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  char *dst;
  char *outbuf;
  size_t rem;
  char *p;
  size_t outlen;
  size_t len;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint *in_stack_ffffffffffffff90;
  vm_val_t *in_stack_ffffffffffffff98;
  ulong local_58;
  byte *local_50;
  size_t local_48;
  
  if ((getp_urlDecode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_urlDecode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_urlDecode::desc,0);
    __cxa_guard_release(&getp_urlDecode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar2 == 0) {
    CVmStack::push(in_RSI);
    sVar3 = vmb_get_len((char *)0x390369);
    local_48 = 0;
    local_50 = (byte *)(in_RDX + 2);
    for (local_58 = sVar3; local_58 != 0; local_58 = local_58 - 1) {
      if ((((*local_50 == 0x25) && (2 < local_58)) && (iVar2 = is_xdigit(L'\0'), iVar2 != 0)) &&
         (iVar2 = is_xdigit(L'\0'), iVar2 != 0)) {
        local_50 = local_50 + 2;
        local_58 = local_58 - 2;
      }
      local_50 = local_50 + 1;
      local_48 = local_48 + 1;
    }
    obj = create((int)((ulong)in_RDI >> 0x20),
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    vm_val_t::set_obj(in_RDI,obj);
    this = vm_objp(0);
    buf = (byte *)cons_get_buf((CVmObjString *)this);
    pbVar4 = buf;
    local_50 = (byte *)(in_RDX + 2);
    for (local_58 = sVar3; local_58 != 0; local_58 = local_58 - 1) {
      if (*local_50 == 0x2b) {
        *pbVar4 = 0x20;
      }
      else if (((*local_50 == 0x25) && (2 < local_58)) &&
              ((iVar2 = is_xdigit(L'\0'), iVar2 != 0 && (iVar2 = is_xdigit(L'\0'), iVar2 != 0)))) {
        iVar2 = value_of_xdigit((int)(char)local_50[1]);
        bVar1 = (byte)(iVar2 << 4);
        iVar2 = value_of_xdigit((int)(char)local_50[2]);
        *pbVar4 = bVar1 | (byte)iVar2;
        local_50 = local_50 + 2;
        local_58 = local_58 - 2;
      }
      else {
        *pbVar4 = *local_50;
      }
      local_50 = local_50 + 1;
      pbVar4 = pbVar4 + 1;
    }
    CCharmapToUni::validate((char *)buf,local_48);
    CVmStack::discard(1);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_urlDecode(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* save my own value for gc protection */
    G_stk->push(self_val);

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* scan the string and determine the size of the result */
    size_t outlen;
    const char *p;
    size_t rem;
    for (outlen = 0, p = str, rem = len ; rem != 0 ; ++p, --rem, ++outlen)
    {
        /* 
         *   if this is a '%xx' sequence, it translates to a single byte;
         *   otherwise just copy the byte as-is 
         */
        if (*p == '%' && rem >= 3 && is_xdigit(*(p+1)) && is_xdigit(*(p+2)))
        {
            /* 
             *   it's a %xx sequence - skip the whole thing and count is as
             *   just one byte of output 
             */
            p += 2;
            rem -= 2;
        }
    }

    /* allocate the return string */
    retval->set_obj(create(vmg_ FALSE, outlen));
    char *outbuf =
        ((CVmObjString *)vm_objp(vmg_ retval->val.obj))->cons_get_buf();
    char *dst = outbuf;

    /* build the return string */
    for (p = str, rem = len ; rem != 0 ; ++p, --rem, ++dst)
    {
        /* 
         *   if it's a '+', translate to a space; otherwise, if this is a
         *   '%xx' sequence, it translates to a single byte; otherwise just
         *   copy the byte as-is 
         */
        if (*p == '+')
        {
            *dst = ' ';
        }
        else if (*p == '%' && rem >= 3
                 && is_xdigit(*(p+1)) && is_xdigit(*(p+2)))
        {
            /* it's a %xx sequence - translate to a byte */
            *dst = (value_of_xdigit(*(p+1)) << 4)
                   | value_of_xdigit(*(p+2));

            /* skip the %xx sequence in the input */
            p += 2;
            rem -= 2;
        }
        else
        {
            /* copy anything else as-is */
            *dst = *p;
        }
    }

    /* validate the resulting UTF8 */
    CCharmapToUni::validate(outbuf, outlen);

    /* discard gc protection */
    G_stk->discard(1);

    /* done */
    return TRUE;
}